

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_>
pbrt::BDPTIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  CameraHandle *in_RCX;
  ParameterDictionary *in_RSI;
  _Head_base<0UL,_pbrt::BDPTIntegrator_*,_false> in_RDI;
  SamplerHandle *in_R8;
  PrimitiveHandle *in_R9;
  bool regularize;
  string lightStrategy;
  bool visualizeWeights;
  bool visualizeStrategies;
  int maxDepth;
  string *in_stack_fffffffffffffdd8;
  ParameterDictionary *in_stack_fffffffffffffde0;
  allocator<char> *in_stack_fffffffffffffe10;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe18;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string *def;
  undefined7 in_stack_fffffffffffffe30;
  ParameterDictionary *this;
  allocator<char> *__args_4;
  undefined4 in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_7;
  bool *in_stack_fffffffffffffea8;
  string local_150 [38];
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128 [39];
  undefined1 local_101 [33];
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [38];
  byte local_92;
  allocator<char> local_91;
  string local_90 [35];
  byte local_6d;
  undefined1 local_59 [37];
  int local_34;
  ParameterDictionary *local_10;
  
  __args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  iVar3 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,0);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  __args_4 = &local_91;
  local_34 = iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  bVar1 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,false)
  ;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  this = local_10;
  local_6d = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  bVar2 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,false)
  ;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_92 = bVar2 & 1;
  if ((((local_6d & 1) != 0) || (local_92 != 0)) && (5 < local_34)) {
    Warning((FileLoc *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
    local_34 = 5;
  }
  def = (string *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  __s = &local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
             (char *)__s,in_stack_fffffffffffffe10);
  ParameterDictionary::GetOneString(this,(string *)CONCAT17(bVar2,in_stack_fffffffffffffe30),def);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  __a = (allocator<char> *)&stack0xfffffffffffffeaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
             (char *)__s,__a);
  bVar1 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,false)
  ;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
  local_12a = bVar1;
  std::
  make_unique<pbrt::BDPTIntegrator,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,int&,bool&,bool&,std::__cxx11::string&,bool&>
            (in_RCX,in_R8,in_R9,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffe60),(int *)__args_4,(bool *)in_RDI._M_head_impl,
             (bool *)in_RSI,__args_7,in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_e0);
  return (__uniq_ptr_data<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>,_true,_true>
          )(tuple<pbrt::BDPTIntegrator_*,_std::default_delete<pbrt::BDPTIntegrator>_>)
           in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<BDPTIntegrator> BDPTIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    bool visualizeStrategies = parameters.GetOneBool("visualizestrategies", false);
    bool visualizeWeights = parameters.GetOneBool("visualizeweights", false);

    if ((visualizeStrategies || visualizeWeights) && maxDepth > 5) {
        Warning(loc, "visualizestrategies/visualizeweights was enabled, limiting "
                     "maxdepth to 5");
        maxDepth = 5;
    }

    std::string lightStrategy = parameters.GetOneString("lightsampler", "power");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<BDPTIntegrator>(camera, sampler, aggregate, lights, maxDepth,
                                            visualizeStrategies, visualizeWeights,
                                            lightStrategy, regularize);
}